

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_from_range(uint64_t min,uint64_t max,uint32_t step)

{
  undefined4 in_EAX;
  roaring_array_t *ra;
  container_t *c;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t value;
  uint8_t type;
  undefined8 uStack_38;
  
  uVar1 = 0x100000000;
  if (max < 0x100000000) {
    uVar1 = max;
  }
  if (min < uVar1 && step != 0) {
    uStack_38._0_4_ = in_EAX;
    ra = &roaring_bitmap_create()->high_low_container;
    if (step < 0x10000) {
      uStack_38 = CONCAT44(step,(undefined4)uStack_38) & 0xffffffffffff;
      do {
        uVar3 = (uint)min & 0xffff;
        uVar2 = uVar1 - ((uint)min & 0xffff0000);
        if (0xffff < uVar2) {
          uVar2 = 0x10000;
        }
        c = container_from_range
                      ((uint8_t *)((long)&uStack_38 + 3),uVar3,(uint32_t)uVar2,
                       (uint16_t)(uStack_38 >> 0x20));
        ra_append(ra,(uint16_t)(min >> 0x10),c,uStack_38._3_1_);
        uVar3 = ~uVar3 + step + (uint32_t)uVar2;
        min = min + (uVar3 - uVar3 % step);
      } while (min < uVar1);
    }
    else {
      for (; (min & 0xffffffff) < max; min = (uint64_t)((uint32_t)min + step)) {
        roaring_bitmap_add((roaring_bitmap_t *)ra,(uint32_t)min);
      }
    }
  }
  else {
    ra = (roaring_array_t *)0x0;
  }
  return (roaring_bitmap_t *)ra;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_from_range(uint64_t min, uint64_t max,
                                            uint32_t step) {
    if(max >= UINT64_C(0x100000000)) {
        max = UINT64_C(0x100000000);
    }
    if (step == 0) return NULL;
    if (max <= min) return NULL;
    roaring_bitmap_t *answer = roaring_bitmap_create();
    if (step >= (1 << 16)) {
        for (uint32_t value = (uint32_t)min; value < max; value += step) {
            roaring_bitmap_add(answer, value);
        }
        return answer;
    }
    uint64_t min_tmp = min;
    do {
        uint32_t key = (uint32_t)min_tmp >> 16;
        uint32_t container_min = min_tmp & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum_uint64(max - (key << 16), 1 << 16);
        uint8_t type;
        container_t *container = container_from_range(&type, container_min,
                                               container_max, (uint16_t)step);
        ra_append(&answer->high_low_container, key, container, type);
        uint32_t gap = container_max - container_min + step - 1;
        min_tmp += gap - (gap % step);
    } while (min_tmp < max);
    // cardinality of bitmap will be ((uint64_t) max - min + step - 1 ) / step
    return answer;
}